

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QVariant * operator+(QVariant *arg1,QVariant *arg2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool *in_RDX;
  bool *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *other;
  double dVar7;
  int int2;
  int int1;
  QVariant *ret;
  QDateTime a1;
  QDateTime a2;
  char *in_stack_fffffffffffffea8;
  QVariant *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  QMessageLogger *in_stack_fffffffffffffec0;
  QTime local_f0;
  undefined4 local_ec;
  QDate local_e8;
  QDateTime local_e0 [8];
  undefined1 *local_d8;
  undefined1 *local_d0;
  char local_c8 [32];
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)0x6863bd);
  iVar1 = QVariant::userType((QVariant *)0x6863c7);
  iVar2 = QVariant::userType((QVariant *)0x6863d5);
  if (iVar1 != iVar2) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffec0,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),in_stack_fffffffffffffea8);
    uVar5 = QVariant::typeName();
    uVar6 = QVariant::typeName();
    QMessageLogger::warning
              (local_c8,"QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",uVar5
               ,uVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp"
               ,2000);
  }
  iVar1 = QVariant::userType((QVariant *)0x68644e);
  if (iVar1 == 2) {
    iVar2 = QVariant::toInt(in_RSI);
    iVar3 = QVariant::toInt(in_RDX);
    if ((iVar2 < 1) || (iVar3 < 0x7fffffff - iVar2)) {
      if ((iVar2 < 0) && (iVar3 <= -0x80000000 - iVar2)) {
        QVariant::QVariant(&local_48,-0x80000000);
        QVariant::operator=((QVariant *)CONCAT44(iVar1,in_stack_fffffffffffffeb8),
                            in_stack_fffffffffffffeb0);
        QVariant::~QVariant(&local_48);
      }
      else {
        QVariant::QVariant(&local_68,iVar2 + iVar3);
        QVariant::operator=((QVariant *)CONCAT44(iVar1,in_stack_fffffffffffffeb8),
                            in_stack_fffffffffffffeb0);
        QVariant::~QVariant(&local_68);
      }
    }
    else {
      QVariant::QVariant(&local_28,0x7fffffff);
      QVariant::operator=((QVariant *)CONCAT44(iVar1,in_stack_fffffffffffffeb8),
                          in_stack_fffffffffffffeb0);
      QVariant::~QVariant(&local_28);
    }
  }
  else if (iVar1 == 6) {
    other = (QVariant *)QVariant::toDouble(in_RSI);
    dVar7 = (double)QVariant::toDouble(in_RDX);
    QVariant::QVariant(&local_88,(double)other + dVar7);
    QVariant::operator=((QVariant *)CONCAT44(iVar1,in_stack_fffffffffffffeb8),other);
    QVariant::~QVariant(&local_88);
  }
  else if (iVar1 == 0x10) {
    local_d0 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    QDate::QDate(&local_e8,100,1,1);
    QDateTime::date();
    QDate::daysTo((QDate *)&local_e8);
    QDateTime::addDays((longlong)&local_d8);
    QDateTime::~QDateTime(local_e0);
    local_ec = QDateTime::time();
    local_f0.mds = QDateTime::time();
    QTime::msecsSinceStartOfDay(&local_f0);
    uVar4 = QTime::addMSecs((int)&local_ec);
    QDateTime::setTime(&local_d8,uVar4,1);
    QVariant::QVariant(&local_a8,(QDateTime *)&local_d8);
    QVariant::operator=((QVariant *)CONCAT44(iVar1,in_stack_fffffffffffffeb8),
                        in_stack_fffffffffffffeb0);
    QVariant::~QVariant(&local_a8);
    QDateTime::~QDateTime((QDateTime *)&local_d8);
    QDateTime::~QDateTime((QDateTime *)&local_d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant operator+(const QVariant &arg1, const QVariant &arg2)
{
    QVariant ret;
    if (Q_UNLIKELY(arg1.userType() != arg2.userType()))
        qWarning("QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",
                 arg1.typeName(), arg2.typeName(), __FILE__, __LINE__);
    switch (arg1.userType()) {
    case QMetaType::Int: {
        const int int1 = arg1.toInt();
        const int int2 = arg2.toInt();
        if (int1 > 0 && (int2 >= INT_MAX - int1)) {
            // The increment overflows
            ret = QVariant(INT_MAX);
        } else if (int1 < 0 && (int2 <= INT_MIN - int1)) {
            // The increment underflows
            ret = QVariant(INT_MIN);
        } else {
            ret = QVariant(int1 + int2);
        }
        break;
    }
    case QMetaType::Double: ret = QVariant(arg1.toDouble() + arg2.toDouble()); break;
#if QT_CONFIG(datetimeparser)
    case QMetaType::QDateTime: {
        QDateTime a2 = arg2.toDateTime();
        QDateTime a1 = arg1.toDateTime().addDays(QDATETIMEEDIT_DATE_MIN.daysTo(a2.date()));
        a1.setTime(a1.time().addMSecs(a2.time().msecsSinceStartOfDay()));
        ret = QVariant(a1);
        break;
    }
#endif // datetimeparser
    default: break;
    }
    return ret;
}